

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O0

void mirror_glyphs(BidiContext *ctx)

{
  uint uVar1;
  ulong local_18;
  size_t i;
  BidiContext *ctx_local;
  
  for (local_18 = 0; local_18 < ctx->textlen; local_18 = local_18 + 1) {
    if ((uint)ctx->levels[local_18] % 2 != 0) {
      uVar1 = mirror_glyph(ctx->text[local_18].wc);
      ctx->text[local_18].wc = uVar1;
    }
  }
  return;
}

Assistant:

static void mirror_glyphs(BidiContext *ctx)
{
    /*
     * Rule L3: any character with a mirror-image pair at an odd
     * embedding level is replaced by its mirror image.
     *
     * This is specified in the standard as happening _after_ rule L2
     * (the actual reordering of the text). But it's much easier to
     * implement it before, while our levels[] array still matches up
     * to the text order.
     */
    for (size_t i = 0; i < ctx->textlen; i++) {
        if (ctx->levels[i] % 2)
            ctx->text[i].wc = mirror_glyph(ctx->text[i].wc);
    }
}